

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopCheck(char *pSop,int nFanins)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  size_t sStack_10;
  
  bVar1 = false;
  bVar2 = false;
  do {
    cVar5 = *pSop;
    if (cVar5 == '\0') {
      if (!bVar2 || !bVar1) {
        return 1;
      }
      pcVar4 = "Abc_SopCheck: SOP has cubes in both phases.\n";
      sStack_10 = 0x2c;
      goto LAB_001dea18;
    }
    pSop = pSop + 3;
    lVar3 = 0;
    while (cVar5 != ' ') {
      pcVar4 = pSop + -2;
      pSop = pSop + 1;
      lVar3 = lVar3 + 1;
      cVar5 = *pcVar4;
    }
    if (nFanins != lVar3) {
      fprintf(_stdout,
              "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n"
              ,lVar3,nFanins);
      return 0;
    }
    cVar5 = pSop[-2];
    if (cVar5 == '0') {
      bVar1 = true;
    }
    else if ((cVar5 != 'x') && (cVar5 != 'n')) {
      if (cVar5 != '1') {
        fprintf(_stdout,
                "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n",
                (ulong)(uint)(int)cVar5,nFanins);
        return 0;
      }
      bVar2 = true;
    }
  } while (pSop[-1] == '\n');
  pcVar4 = "Abc_SopCheck: SOP has a cube without new line in the end.\n";
  sStack_10 = 0x3a;
LAB_001dea18:
  fwrite(pcVar4,sStack_10,1,_stdout);
  return 0;
}

Assistant:

int Abc_SopCheck( char * pSop, int nFanins )
{
    char * pCubes, * pCubesOld;
    int fFound0 = 0, fFound1 = 0;

    // check the logic function of the node
    for ( pCubes = pSop; *pCubes; pCubes++ )
    {
        // get the end of the next cube
        for ( pCubesOld = pCubes; *pCubes != ' '; pCubes++ );
        // compare the distance
        if ( pCubes - pCubesOld != nFanins )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n",
                (int)(ABC_PTRDIFF_T)(pCubes - pCubesOld), nFanins );
            return 0;
        }
        // check the output values for this cube
        pCubes++;
        if ( *pCubes == '0' )
            fFound0 = 1;
        else if ( *pCubes == '1' )
            fFound1 = 1;
        else if ( *pCubes != 'x' && *pCubes != 'n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n", *pCubes );
            return 0;
        }
        // check the last symbol (new line)
        pCubes++;
        if ( *pCubes != '\n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a cube without new line in the end.\n" );
            return 0;
        }
    }
    if ( fFound0 && fFound1 )
    {
        fprintf( stdout, "Abc_SopCheck: SOP has cubes in both phases.\n" );
        return 0;
    }
    return 1;
}